

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3UniqueConstraint(Parse *pParse,int onError,Index *pIdx)

{
  Table *pTVar1;
  char *pcVar2;
  ulong uVar3;
  StrAccum errMsg;
  StrAccum local_60;
  int local_3c;
  Parse *local_38;
  
  pTVar1 = pIdx->pTable;
  local_60.db = pParse->db;
  local_60.mxAlloc = (local_60.db)->aLimit[0];
  local_60.zText = (char *)0x0;
  local_60.nAlloc = 0;
  local_60.nChar = 0;
  local_60.accError = '\0';
  local_60.printfFlags = '\0';
  local_3c = onError;
  local_38 = pParse;
  if (pIdx->aColExpr == (ExprList *)0x0) {
    if (pIdx->nKeyCol != 0) {
      uVar3 = 0;
      do {
        pcVar2 = pTVar1->aCol[pIdx->aiColumn[uVar3]].zCnName;
        if (uVar3 != 0) {
          if (local_60.nChar + 2 < local_60.nAlloc) {
            (local_60.zText + local_60.nChar)[0] = ',';
            (local_60.zText + local_60.nChar)[1] = ' ';
            local_60.nChar = local_60.nChar + 2;
          }
          else {
            enlargeAndAppend(&local_60,", ",2);
          }
        }
        sqlite3_str_appendall(&local_60,pTVar1->zName);
        if (local_60.nChar + 1 < local_60.nAlloc) {
          local_60.zText[local_60.nChar] = '.';
          local_60.nChar = local_60.nChar + 1;
        }
        else {
          enlargeAndAppend(&local_60,".",1);
        }
        sqlite3_str_appendall(&local_60,pcVar2);
        uVar3 = uVar3 + 1;
      } while (uVar3 < pIdx->nKeyCol);
    }
  }
  else {
    sqlite3_str_appendf(&local_60,"index \'%q\'",pIdx->zName);
  }
  pcVar2 = sqlite3StrAccumFinish(&local_60);
  sqlite3HaltConstraint
            (local_38,(uint)((*(ushort *)&pIdx->field_0x63 & 3) != 2) * 0x200 + 0x613,local_3c,
             pcVar2,-6,'\x02');
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UniqueConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Constraint type */
  Index *pIdx       /* The index that triggers the constraint */
){
  char *zErr;
  int j;
  StrAccum errMsg;
  Table *pTab = pIdx->pTable;

  sqlite3StrAccumInit(&errMsg, pParse->db, 0, 0,
                      pParse->db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( pIdx->aColExpr ){
    sqlite3_str_appendf(&errMsg, "index '%q'", pIdx->zName);
  }else{
    for(j=0; j<pIdx->nKeyCol; j++){
      char *zCol;
      assert( pIdx->aiColumn[j]>=0 );
      zCol = pTab->aCol[pIdx->aiColumn[j]].zCnName;
      if( j ) sqlite3_str_append(&errMsg, ", ", 2);
      sqlite3_str_appendall(&errMsg, pTab->zName);
      sqlite3_str_append(&errMsg, ".", 1);
      sqlite3_str_appendall(&errMsg, zCol);
    }
  }
  zErr = sqlite3StrAccumFinish(&errMsg);
  sqlite3HaltConstraint(pParse,
    IsPrimaryKeyIndex(pIdx) ? SQLITE_CONSTRAINT_PRIMARYKEY
                            : SQLITE_CONSTRAINT_UNIQUE,
    onError, zErr, P4_DYNAMIC, P5_ConstraintUnique);
}